

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void delete_all(int selected_only)

{
  Fl_Type *pFVar1;
  Fl_Type *g;
  Fl_Type *f;
  int selected_only_local;
  
  g = Fl_Type::first;
  pFVar1 = g;
  while (g = pFVar1, g != (Fl_Type *)0x0) {
    if ((g->selected == '\0') && (selected_only != 0)) {
      pFVar1 = g->next;
    }
    else {
      delete_children(g);
      pFVar1 = g->next;
      if (g != (Fl_Type *)0x0) {
        (*g->_vptr_Fl_Type[2])();
      }
    }
  }
  if (selected_only == 0) {
    include_H_from_C = 1;
    use_FL_COMMAND = 0;
  }
  selection_changed((Fl_Type *)0x0);
  return;
}

Assistant:

void delete_all(int selected_only) {
  for (Fl_Type *f = Fl_Type::first; f;) {
    if (f->selected || !selected_only) {
      delete_children(f);
      Fl_Type *g = f->next;
      delete f;
      f = g;
    } else f = f->next;
  }
  if(!selected_only) {
		include_H_from_C=1;
		use_FL_COMMAND=0;
	}

  selection_changed(0);
}